

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zfio.c
# Opt level: O2

zfp * zfopen(char *path,char *mode)

{
  zfp *__ptr;
  FILE *__stream;
  size_t sVar1;
  gzFile pgVar2;
  char path2 [1024];
  
  __ptr = (zfp *)calloc(1,0x10);
  if (__ptr == (zfp *)0x0) {
    return (zfp *)0x0;
  }
  if ((*mode != 'z') && (mode[1] != 'z')) {
    __stream = fopen(path,mode);
    __ptr->fp = (FILE *)__stream;
    if (__stream != (FILE *)0x0) {
      sVar1 = fread(path2,1,2,__stream);
      if (sVar1 != 2) goto LAB_00132459;
      if ((path2[0] != '\x1f') || (path2[1] != -0x75)) {
        fseeko(__stream,0,0);
        return __ptr;
      }
      fclose(__stream);
      __ptr->fp = (FILE *)0x0;
    }
  }
  pgVar2 = (gzFile)gzopen(path,mode);
  __ptr->gz = pgVar2;
  if (pgVar2 != (gzFile)0x0) {
    return __ptr;
  }
  sprintf(path2,"%.*s.gz",0x3fc,path);
  pgVar2 = (gzFile)gzopen(path2,mode);
  __ptr->gz = pgVar2;
  if (pgVar2 != (gzFile)0x0) {
    return __ptr;
  }
  perror(path);
LAB_00132459:
  free(__ptr);
  return (zfp *)0x0;
}

Assistant:

zfp *zfopen(const char *path, const char *mode) {
    char path2[1024];
    zfp *zf;

    if (!(zf = (zfp *)malloc(sizeof(*zf))))
	return NULL;
    zf->fp = NULL;
    zf->gz = NULL;

    /* Try normal fopen */
    if (mode[0] != 'z' && mode[1] != 'z' &&
	NULL != (zf->fp = fopen(path, mode))) {
	unsigned char magic[2];
	if (2 != fread(magic, 1, 2, zf->fp)) {
	    free(zf);
	    return NULL;
	}
	if (!(magic[0] == 0x1f &&
	      magic[1] == 0x8b)) {
	    fseeko(zf->fp, 0, SEEK_SET);
	    return zf;
	}

	fclose(zf->fp);
	zf->fp = NULL;
    }

#ifdef HAVE_POPEN
    /*
     * I've no idea why, by gzgets is VERY slow, maybe because it handles
     * arbitrary seeks.
     * popen to gzip -cd is 3 times faster though.
     */
    if (*mode == 'w') {
    } else {
	if (access(path, R_OK) == 0) {
	    sprintf(path2, "gzip -cd < %.*s", 1000, path);
	    if (NULL != (zf->fp = popen(path2, "r")))
		return zf;
	}
	
	sprintf(path2, "gzip -cd < %.*s.gz", 1000, path);
	if (NULL != (zf->fp = popen(path2, "r")))
	    return zf;

	printf("Failed on %s\n", path);
    } else {
	sprintf(path2, "gzip > %.*s", 1000, path);
	if (NULL != (zf->fp = popen(path2, "w")))
	    return zf;
	}
	
	printf("Failed on %s\n", path);
    }
#else
    /* Gzopen instead */
    if ((zf->gz = gzopen(path, mode)))
	return zf;

    sprintf(path2, "%.*s.gz", 1020, path);
    if ((zf->gz = gzopen(path2, mode)))
	return zf;
#endif

    perror(path);

    free(zf);
    return NULL;
}